

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t try_skip_sfx(archive_read *a)

{
  size_t local_58;
  ssize_t window;
  ssize_t bytes;
  size_t total;
  size_t skip;
  char *q;
  void *h;
  char signature [8];
  char *p;
  archive_read *a_local;
  
  signature = (char  [8])__archive_read_ahead(a,7,(ssize_t *)0x0);
  if (signature == (char  [8])0x0) {
    a_local._4_4_ = L'\x01';
  }
  else if (((*(char *)signature == 'M') && (*(char *)((long)signature + 1) == 'Z')) ||
          (*(int *)signature == 0x464c457f)) {
    bytes = 0;
    local_58 = 0x1000;
    rar5_signature((char *)&h);
    do {
      while( true ) {
        if (0x80000 < bytes + local_58) goto LAB_00af39e5;
        q = (char *)__archive_read_ahead(a,local_58,&window);
        if ((char  [8])q == (char  [8])0x0) break;
        if (window < 0x40) goto LAB_00af39ee;
        skip = (long)q + window;
        for (signature = (char  [8])q; (char *)((long)signature + 8U) < skip;
            signature = (char  [8])((long)signature + 0x10)) {
          if (*(void **)signature == h) {
            total = (long)signature - (long)q;
            __archive_read_consume(a,total);
            return L'\0';
          }
        }
        total = (long)signature - (long)q;
        __archive_read_consume(a,total);
        bytes = total + bytes;
      }
      local_58 = (long)local_58 >> 1;
    } while (0x3f < local_58);
LAB_00af39ee:
    archive_set_error(&a->archive,0x54,"Couldn\'t find out RAR header");
    a_local._4_4_ = L'\xffffffe2';
  }
  else {
LAB_00af39e5:
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

static int try_skip_sfx(struct archive_read *a)
{
	const char *p;

	if ((p = __archive_read_ahead(a, 7, NULL)) == NULL)
		return ARCHIVE_EOF;

	if ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0)
	{
		char signature[sizeof(rar5_signature_xor)];
		const void *h;
		const char *q;
		size_t skip, total = 0;
		ssize_t bytes, window = 4096;

		rar5_signature(signature);

		while (total + window <= (1024 * 512)) {
			h = __archive_read_ahead(a, window, &bytes);
			if (h == NULL) {
				/* Remaining bytes are less than window. */
				window >>= 1;
				if (window < 0x40)
					goto fatal;
				continue;
			}
			if (bytes < 0x40)
				goto fatal;
			p = h;
			q = p + bytes;

			/*
			 * Scan ahead until we find something that looks
			 * like the RAR header.
			 */
			while (p + 8 < q) {
				if (memcmp(p, signature, sizeof(signature)) == 0) {
					skip = p - (const char *)h;
					__archive_read_consume(a, skip);
					return (ARCHIVE_OK);
				}
				p += 0x10;
			}
			skip = p - (const char *)h;
			__archive_read_consume(a, skip);
			total += skip;
		}
	}

	return ARCHIVE_OK;
fatal:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
			"Couldn't find out RAR header");
	return (ARCHIVE_FATAL);
}